

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O3

void __thiscall IDisk::SetWrite(IDisk *this,int side,uint track)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  MFMTrack *pMVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  MFMTrack *pMVar8;
  long lVar9;
  uchar *__s;
  ulong uVar10;
  Side *pSVar11;
  ulong uVar12;
  
  uVar3 = this->side_[side].nb_tracks;
  if (track < uVar3) {
    return;
  }
  pSVar11 = this->side_ + side;
  pMVar4 = pSVar11->tracks;
  pMVar8 = (MFMTrack *)operator_new__((ulong)(track + 1) << 5);
  pSVar11->tracks = pMVar8;
  uVar12 = (ulong)track;
  memset(pMVar8,0,uVar12 * 0x20 + 1);
  if (uVar3 == 0) {
    if (pMVar4 == (MFMTrack *)0x0) goto LAB_00149381;
  }
  else {
    lVar9 = 0;
    uVar10 = 0;
    do {
      pMVar8 = pSVar11->tracks;
      puVar1 = (undefined8 *)((long)&pMVar4->revolution + lVar9);
      uVar5 = *puVar1;
      uVar6 = puVar1[1];
      puVar1 = (undefined8 *)((long)&pMVar4->bitfield + lVar9);
      uVar7 = puVar1[1];
      puVar2 = (undefined8 *)((long)&pMVar8->bitfield + lVar9);
      *puVar2 = *puVar1;
      puVar2[1] = uVar7;
      puVar1 = (undefined8 *)((long)&pMVar8->revolution + lVar9);
      *puVar1 = uVar5;
      puVar1[1] = uVar6;
      uVar10 = uVar10 + 1;
      lVar9 = lVar9 + 0x20;
    } while (uVar10 < this->side_[side].nb_tracks);
  }
  operator_delete__(pMVar4);
LAB_00149381:
  this->side_[side].nb_tracks = track + 1;
  this->disk_modified_ = true;
  __s = (uchar *)operator_new__(0x40000);
  pMVar4 = pSVar11->tracks;
  pMVar4[uVar12].bitfield = __s;
  pMVar4[uVar12].size = 0x40000;
  memset(__s,0,0x40000);
  this->head_position_ = 0;
  return;
}

Assistant:

void IDisk::SetWrite(int side, unsigned int track)
{
   // Set only one revolution here... And 6500 byte for this track.
   if (track >= side_[side].nb_tracks)
   {
      // Add a track !
      MFMTrack* tmp = side_[side].tracks;

      // Copy existing tracks
      side_[side].tracks = new MFMTrack[track + 1];
      memset(side_[side].tracks, 0, sizeof(MFMTrack) * track + 1);
      for (unsigned int i = 0; i < side_[side].nb_tracks; i++)
      {
         memcpy(&side_[side].tracks[i], &tmp[i], sizeof(MFMTrack));
      }

      // Delete old
      delete[]tmp;

      // Replace
      side_[side].nb_tracks = track + 1;

      disk_modified_ = true;
      side_[side].tracks[track].bitfield = new unsigned char [DEFAULT_TRACK_SIZE * 16];
      side_[side].tracks[track].size = DEFAULT_TRACK_SIZE * 16;
      memset(side_[side].tracks[track].bitfield, 0, DEFAULT_TRACK_SIZE * 16);

      head_position_ = 0;
   }
}